

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor_internal.h
# Opt level: O3

void __thiscall
absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::compiler::rust::Options>::
~StatusOrData(StatusOrData<google::protobuf::compiler::rust::Options> *this)

{
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::compiler::rust::Options>_1 this_00;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this_00 = this->field_0;
  if (this_00 ==
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::compiler::rust::Options>_1)0x1) {
    pcVar1 = (this->field_1).data_.generated_entry_point_rs_file_name._M_dataplus._M_p;
    paVar2 = &(this->field_1).data_.generated_entry_point_rs_file_name.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != paVar2) {
      operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    }
    pcVar1 = (this->field_1).data_.mapping_file_path._M_dataplus._M_p;
    paVar2 = &(this->field_1).data_.mapping_file_path.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != paVar2) {
      operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
      return;
    }
  }
  else if (((ulong)this_00 & 1) == 0) {
    status_internal::StatusRep::Unref((StatusRep *)this_00);
  }
  return;
}

Assistant:

~StatusOrData() {
    if (ok()) {
      status_.~Status();
      data_.~T();
    } else {
      status_.~Status();
    }
  }